

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::EndInitExpr(TypeChecker *this)

{
  LabelType LVar1;
  Result RVar2;
  Enum EVar3;
  Label *in_RAX;
  Label *label;
  Label *local_18;
  
  local_18 = in_RAX;
  RVar2 = GetLabel(this,0,&local_18);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    LVar1 = local_18->label_type;
    RVar2 = OnEnd(this,local_18,"initializer expression","initializer expression");
    EVar3 = (Enum)(RVar2.enum_ == Error || LVar1 != InitExpr);
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::EndInitExpr() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::InitExpr);
  result |= OnEnd(label, "initializer expression", "initializer expression");
  return result;
}